

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 *in_RSI;
  int in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  int raw;
  int verbose;
  char *arg;
  int argn;
  undefined4 uVar2;
  int minchars;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  
  minchars = 0;
  uVar2 = 0;
  progname = (char *)*in_RSI;
  if ((progname == (char *)0x0) || (*progname == '\0')) {
    progname = "rdjpgcom";
  }
  iVar3 = 1;
  while ((iVar3 < in_EDI &&
         (in_stack_ffffffffffffffe0 = (char *)in_RSI[iVar3], *in_stack_ffffffffffffffe0 == '-'))) {
    in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 + 1;
    iVar1 = keymatch((char *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
                     minchars);
    if (iVar1 == 0) {
      iVar1 = keymatch((char *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
                       minchars);
      if (iVar1 == 0) {
        usage();
      }
      else {
        uVar2 = 1;
      }
    }
    else {
      minchars = minchars + 1;
    }
    iVar3 = iVar3 + 1;
  }
  iVar1 = (int)in_stack_ffffffffffffffe0;
  if (iVar3 < in_EDI + -1) {
    fprintf(_stderr,"%s: only one input file\n",progname);
    usage();
  }
  if (iVar3 < in_EDI) {
    infile = (FILE *)fopen((char *)in_RSI[iVar3],"rb");
    if ((FILE *)infile == (FILE *)0x0) {
      fprintf(_stderr,"%s: can\'t open %s\n",progname,in_RSI[iVar3],in_R8,in_R9,uVar2);
      exit(1);
    }
  }
  else {
    infile = _stdin;
  }
  scan_JPEG_header(iVar1,minchars);
  exit(0);
}

Assistant:

int
main(int argc, char **argv)
{
  int argn;
  char *arg;
  int verbose = 0, raw = 0;

  /* On Mac, fetch a command line. */
#ifdef USE_CCOMMAND
  argc = ccommand(&argv);
#endif

  progname = argv[0];
  if (progname == NULL || progname[0] == 0)
    progname = "rdjpgcom";      /* in case C library doesn't provide it */

  /* Parse switches, if any */
  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (arg[0] != '-')
      break;                    /* not switch, must be file name */
    arg++;                      /* advance over '-' */
    if (keymatch(arg, "verbose", 1)) {
      verbose++;
    } else if (keymatch(arg, "raw", 1)) {
      raw = 1;
    } else
      usage();
  }

  /* Open the input file. */
  /* Unix style: expect zero or one file name */
  if (argn < argc - 1) {
    fprintf(stderr, "%s: only one input file\n", progname);
    usage();
  }
  if (argn < argc) {
    if ((infile = fopen(argv[argn], READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, argv[argn]);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default input file is stdin */
#ifdef USE_SETMODE              /* need to hack file mode? */
    setmode(fileno(stdin), O_BINARY);
#endif
#ifdef USE_FDOPEN               /* need to re-open in binary mode? */
    if ((infile = fdopen(fileno(stdin), READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open stdin\n", progname);
      exit(EXIT_FAILURE);
    }
#else
    infile = stdin;
#endif
  }

  /* Scan the JPEG headers. */
  (void)scan_JPEG_header(verbose, raw);

  /* All done. */
  exit(EXIT_SUCCESS);
  return 0;                     /* suppress no-return-value warnings */
}